

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

void NJamSpell::
     InitializeBuckets<std::unordered_map<std::pair<unsigned_int,unsigned_int>,unsigned_int,NJamSpell::TGram2KeyHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,unsigned_int>>>>
               (unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
                *grams,TPerfectHash *ph,
               vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
               *buckets)

{
  bool bVar1;
  uint32_t uVar2;
  reference key_00;
  size_type sVar3;
  ostream *poVar4;
  reference this;
  pair<unsigned_short,_unsigned_short> local_78 [2];
  pair<unsigned_short,_unsigned_short> data;
  NJamSpell local_60 [4];
  uint32_t bucket;
  string key;
  value_type *it;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
  *__range2;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *buckets_local;
  TPerfectHash *ph_local;
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
  *grams_local;
  
  __end0 = std::
           unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
           ::begin(grams);
  it = (value_type *)
       std::
       unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_int,_NJamSpell::TGram2KeyHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>_>_>
       ::end(grams);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_true>
                         *)&it);
    if (!bVar1) {
      return;
    }
    key_00 = std::__detail::
             _Node_const_iterator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_false,_true>
             ::operator*(&__end0);
    DumpKey<std::pair<unsigned_int,unsigned_int>>(local_60,&key_00->first);
    uVar2 = TPerfectHash::Hash(ph,(string *)local_60);
    sVar3 = std::
            vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
            ::size(buckets);
    if (sVar3 <= uVar2) {
      poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,uVar2);
      poVar4 = std::operator<<(poVar4," ");
      sVar3 = std::
              vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
              ::size(buckets);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
      std::operator<<(poVar4,"\n");
    }
    sVar3 = std::
            vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
            ::size(buckets);
    if (sVar3 <= uVar2) break;
    std::pair<unsigned_short,_unsigned_short>::pair<unsigned_short,_unsigned_short,_true>(local_78);
    local_78[0].first = CityHash16((string *)local_60);
    local_78[0].second = PackInt32(key_00->second);
    this = std::
           vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           ::operator[](buckets,(ulong)uVar2);
    std::pair<unsigned_short,_unsigned_short>::operator=(this,local_78);
    std::__cxx11::string::~string((string *)local_60);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_int>,_false,_true>
    ::operator++(&__end0);
  }
  __assert_fail("bucket < buckets.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/jamspell/lang_model.cpp"
                ,0x5a,
                "void NJamSpell::InitializeBuckets(const T &, TPerfectHash &, std::vector<std::pair<uint16_t, uint16_t>> &) [T = std::unordered_map<std::pair<unsigned int, unsigned int>, unsigned int, NJamSpell::TGram2KeyHash>]"
               );
}

Assistant:

void InitializeBuckets(const T& grams, TPerfectHash& ph, std::vector<std::pair<uint16_t, uint16_t>>& buckets) {
    for (auto&& it: grams) {
        std::string key = DumpKey(it.first);
        uint32_t bucket = ph.Hash(key);
        if (bucket >= buckets.size()) {
            std::cerr << bucket << " " << buckets.size() << "\n";
        }
        assert(bucket < buckets.size());
        std::pair<uint16_t, uint16_t> data;
        data.first = CityHash16(key);
        data.second = PackInt32(it.second);
        buckets[bucket] = data;
    }
}